

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imaxdiv.c
# Opt level: O0

int main(void)

{
  imaxdiv_t iVar1;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  imaxdiv_t result;
  
  iVar1 = imaxdiv(5,2);
  local_30 = iVar1.quot;
  local_28 = iVar1.rem;
  if ((local_30 != 2) || (local_28 != 1)) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/imaxdiv.c, line %d - %s\n"
           ,0x1d,"result.quot == 2 && result.rem == 1");
  }
  iVar1 = imaxdiv(-5,2);
  local_40 = iVar1.quot;
  local_38 = iVar1.rem;
  if ((local_40 != -2) || (local_38 != -1)) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/imaxdiv.c, line %d - %s\n"
           ,0x1f,"result.quot == -2 && result.rem == -1");
  }
  iVar1 = imaxdiv(5,-2);
  local_50 = iVar1.quot;
  local_48 = iVar1.rem;
  if ((local_50 != -2) || (local_48 != 1)) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/imaxdiv.c, line %d - %s\n"
           ,0x21,"result.quot == -2 && result.rem == 1");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    imaxdiv_t result;
    result = imaxdiv( ( intmax_t )5, ( intmax_t )2 );
    TESTCASE( result.quot == 2 && result.rem == 1 );
    result = imaxdiv( ( intmax_t )-5, ( intmax_t )2 );
    TESTCASE( result.quot == -2 && result.rem == -1 );
    result = imaxdiv( ( intmax_t )5, ( intmax_t )-2 );
    TESTCASE( result.quot == -2 && result.rem == 1 );
    TESTCASE( sizeof( result.quot ) == sizeof( intmax_t ) );
    TESTCASE( sizeof( result.rem )  == sizeof( intmax_t ) );
    return TEST_RESULTS;
}